

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O0

void Hacl_Bignum256_32_sub_mod(uint32_t *n,uint32_t *a,uint32_t *b,uint32_t *res)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint32_t x_7;
  uint32_t *os_7;
  uint32_t x_6;
  uint32_t *os_6;
  uint32_t x_5;
  uint32_t *os_5;
  uint32_t x_4;
  uint32_t *os_4;
  uint32_t x_3;
  uint32_t *os_3;
  uint32_t x_2;
  uint32_t *os_2;
  uint32_t x_1;
  uint32_t *os_1;
  uint32_t x;
  uint32_t *os;
  uint32_t i_2;
  uint32_t c2;
  uint32_t c1;
  uint32_t *res_i_3;
  uint32_t t2_3;
  uint32_t t12_3;
  uint32_t *res_i2_3;
  uint32_t t22_3;
  uint32_t t11_3;
  uint32_t *res_i1_3;
  uint32_t t21_3;
  uint32_t t10_3;
  uint32_t *res_i0_3;
  uint32_t t20_3;
  uint32_t t1_3;
  uint32_t *res_i_2;
  uint32_t t2_2;
  uint32_t t12_2;
  uint32_t *res_i2_2;
  uint32_t t22_2;
  uint32_t t11_2;
  uint32_t *res_i1_2;
  uint32_t t21_2;
  uint32_t t10_2;
  uint32_t *res_i0_2;
  uint32_t t20_2;
  uint32_t t1_2;
  uint32_t i_1;
  uint32_t c;
  uint32_t tmp [8];
  uint32_t c00;
  uint32_t *res_i_1;
  uint32_t t2_1;
  uint32_t t12_1;
  uint32_t *res_i2_1;
  uint32_t t22_1;
  uint32_t t11_1;
  uint32_t *res_i1_1;
  uint32_t t21_1;
  uint32_t t10_1;
  uint32_t *res_i0_1;
  uint32_t t20_1;
  uint32_t t1_1;
  uint32_t *res_i;
  uint32_t t2;
  uint32_t t12;
  uint32_t *res_i2;
  uint32_t t22;
  uint32_t t11;
  uint32_t *res_i1;
  uint32_t t21;
  uint32_t t10;
  uint32_t *res_i0;
  uint32_t t20;
  uint32_t t1;
  uint32_t i;
  uint32_t c0;
  uint32_t *res_local;
  uint32_t *b_local;
  uint32_t *a_local;
  uint32_t *n_local;
  
  uVar1 = *a;
  uVar2 = *b;
  *res = uVar1 - uVar2;
  uVar3 = a[1];
  uVar4 = b[1];
  uVar14 = (uint)(uVar1 < uVar2);
  uVar15 = uVar3 - uVar4;
  res[1] = uVar15 - uVar14;
  uVar1 = a[2];
  uVar2 = b[2];
  uVar14 = (uint)(uVar3 < uVar4 || uVar15 < uVar14);
  uVar15 = uVar1 - uVar2;
  res[2] = uVar15 - uVar14;
  uVar3 = a[3];
  uVar4 = b[3];
  uVar14 = (uint)(uVar1 < uVar2 || uVar15 < uVar14);
  uVar15 = uVar3 - uVar4;
  res[3] = uVar15 - uVar14;
  uVar1 = a[4];
  uVar2 = b[4];
  uVar14 = (uint)(uVar3 < uVar4 || uVar15 < uVar14);
  uVar15 = uVar1 - uVar2;
  res[4] = uVar15 - uVar14;
  uVar3 = a[5];
  uVar4 = b[5];
  uVar14 = (uint)(uVar1 < uVar2 || uVar15 < uVar14);
  uVar15 = uVar3 - uVar4;
  res[5] = uVar15 - uVar14;
  uVar1 = a[6];
  uVar2 = b[6];
  uVar14 = (uint)(uVar3 < uVar4 || uVar15 < uVar14);
  uVar15 = uVar1 - uVar2;
  res[6] = uVar15 - uVar14;
  uVar3 = a[7];
  uVar4 = b[7];
  uVar1 = (uint)(uVar1 < uVar2 || uVar15 < uVar14);
  uVar2 = uVar3 - uVar4;
  res[7] = uVar2 - uVar1;
  tmp[7] = (uint32_t)(uVar3 < uVar4 || uVar2 < uVar1);
  memset(&i_1,0,0x20);
  uVar3 = (uint)CARRY4(*res,*n);
  uVar8 = res[1] + n[1];
  uVar4 = (uint)(CARRY4(res[1],n[1]) || CARRY4(uVar8,uVar3));
  uVar9 = res[2] + n[2];
  uVar14 = (uint)(CARRY4(res[2],n[2]) || CARRY4(uVar9,uVar4));
  uVar10 = res[3] + n[3];
  uVar15 = (uint)(CARRY4(res[3],n[3]) || CARRY4(uVar10,uVar14));
  uVar11 = res[4] + n[4];
  uVar6 = (uint)(CARRY4(res[4],n[4]) || CARRY4(uVar11,uVar15));
  uVar12 = res[5] + n[5];
  uVar1 = res[6];
  uVar2 = n[6];
  uVar7 = (uint)(CARRY4(res[5],n[5]) || CARRY4(uVar12,uVar6));
  uVar13 = uVar1 + uVar2;
  uVar5 = n[7];
  uVar16 = -tmp[7];
  *res = uVar16 & *res + *n | (uVar16 ^ 0xffffffff) & *res;
  res[1] = uVar16 & uVar8 + uVar3 | (uVar16 ^ 0xffffffff) & res[1];
  res[2] = uVar16 & uVar9 + uVar4 | (uVar16 ^ 0xffffffff) & res[2];
  res[3] = uVar16 & uVar10 + uVar14 | (uVar16 ^ 0xffffffff) & res[3];
  res[4] = uVar16 & uVar11 + uVar15 | (uVar16 ^ 0xffffffff) & res[4];
  res[5] = uVar16 & uVar12 + uVar6 | (uVar16 ^ 0xffffffff) & res[5];
  res[6] = uVar16 & uVar13 + uVar7 | (uVar16 ^ 0xffffffff) & res[6];
  res[7] = uVar16 & res[7] + uVar5 + (uint)(CARRY4(uVar1,uVar2) || CARRY4(uVar13,uVar7)) |
           (uVar16 ^ 0xffffffff) & res[7];
  return;
}

Assistant:

void Hacl_Bignum256_32_sub_mod(uint32_t *n, uint32_t *a, uint32_t *b, uint32_t *res)
{
  uint32_t c0 = 0U;
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t t1 = a[4U * i];
    uint32_t t20 = b[4U * i];
    uint32_t *res_i0 = res + 4U * i;
    c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c0, t1, t20, res_i0);
    uint32_t t10 = a[4U * i + 1U];
    uint32_t t21 = b[4U * i + 1U];
    uint32_t *res_i1 = res + 4U * i + 1U;
    c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c0, t10, t21, res_i1);
    uint32_t t11 = a[4U * i + 2U];
    uint32_t t22 = b[4U * i + 2U];
    uint32_t *res_i2 = res + 4U * i + 2U;
    c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c0, t11, t22, res_i2);
    uint32_t t12 = a[4U * i + 3U];
    uint32_t t2 = b[4U * i + 3U];
    uint32_t *res_i = res + 4U * i + 3U;
    c0 = Lib_IntTypes_Intrinsics_sub_borrow_u32(c0, t12, t2, res_i););
  uint32_t c00 = c0;
  uint32_t tmp[8U] = { 0U };
  uint32_t c = 0U;
  KRML_MAYBE_FOR2(i,
    0U,
    2U,
    1U,
    uint32_t t1 = res[4U * i];
    uint32_t t20 = n[4U * i];
    uint32_t *res_i0 = tmp + 4U * i;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t1, t20, res_i0);
    uint32_t t10 = res[4U * i + 1U];
    uint32_t t21 = n[4U * i + 1U];
    uint32_t *res_i1 = tmp + 4U * i + 1U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t10, t21, res_i1);
    uint32_t t11 = res[4U * i + 2U];
    uint32_t t22 = n[4U * i + 2U];
    uint32_t *res_i2 = tmp + 4U * i + 2U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t11, t22, res_i2);
    uint32_t t12 = res[4U * i + 3U];
    uint32_t t2 = n[4U * i + 3U];
    uint32_t *res_i = tmp + 4U * i + 3U;
    c = Lib_IntTypes_Intrinsics_add_carry_u32(c, t12, t2, res_i););
  uint32_t c1 = c;
  KRML_MAYBE_UNUSED_VAR(c1);
  uint32_t c2 = 0U - c00;
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t *os = res;
    uint32_t x = (c2 & tmp[i]) | (~c2 & res[i]);
    os[i] = x;);
}